

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupTrim(Aig_Man_t *p)

{
  char *pcVar1;
  int *piVar2;
  Aig_Type_t AVar3;
  uint uVar4;
  int iVar5;
  Aig_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  Aig_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  Aig_Type_t AVar11;
  Aig_Obj_t *p1;
  long lVar12;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  iVar5 = p->nBarBufs;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = iVar5;
  Aig_ManCleanData(p);
  pVVar10 = p->vObjs;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      piVar2 = (int *)pVVar10->pArray[lVar12];
      if (piVar2 != (int *)0x0) {
        AVar3 = (Aig_Type_t)*(undefined8 *)(piVar2 + 6);
        if ((AVar3 & AIG_OBJ_VOID) - AIG_OBJ_VOID < 0xfffffffe) {
          AVar11 = AVar3 & AIG_OBJ_VOID;
          if (AVar11 == AIG_OBJ_CO) {
            if (((ulong)piVar2 & 1) != 0) goto LAB_005ff889;
            uVar8 = *(ulong *)(piVar2 + 2) & 0xfffffffffffffffe;
            if (uVar8 == 0) {
              pAVar9 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar9 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)(piVar2 + 2) & 1) ^ *(ulong *)(uVar8 + 0x28));
            }
            pAVar9 = Aig_ObjCreateCo(p_00,pAVar9);
          }
          else if (AVar11 == AIG_OBJ_CI) {
            if ((AVar3 < 0x40) && (*piVar2 < p->nTruePis)) {
              pAVar9 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar9 = Aig_ObjCreateCi(p_00);
            }
          }
          else {
            if (((ulong)piVar2 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                            ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
            }
            if (AVar11 != AIG_OBJ_CONST1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                            ,0x1b6,"Aig_Man_t *Aig_ManDupTrim(Aig_Man_t *)");
            }
            pAVar9 = p_00->pConst1;
          }
        }
        else {
          if (((ulong)piVar2 & 1) != 0) {
LAB_005ff889:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar8 = *(ulong *)(piVar2 + 2) & 0xfffffffffffffffe;
          if (uVar8 == 0) {
            pAVar9 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar9 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)(piVar2 + 2) & 1) ^ *(ulong *)(uVar8 + 0x28));
          }
          uVar8 = *(ulong *)(piVar2 + 4) & 0xfffffffffffffffe;
          if (uVar8 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)((ulong)((uint)*(ulong *)(piVar2 + 4) & 1) ^ *(ulong *)(uVar8 + 0x28))
            ;
          }
          pAVar9 = Aig_Oper(p_00,pAVar9,p1,AVar3 & AIG_OBJ_VOID);
        }
        *(Aig_Obj_t **)(piVar2 + 10) = pAVar9;
        pVVar10 = p->vObjs;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar10->nSize);
  }
  if (p->nObjs[6] + p->nObjs[5] == p_00->nObjs[6] + p_00->nObjs[5]) {
    uVar4 = Aig_ManCleanup(p_00);
    if (uVar4 != 0) {
      printf("Aig_ManDupTrim(): Cleanup after AIG duplication removed %d nodes.\n",(ulong)uVar4);
    }
    Aig_ManSetRegNum(p_00,p->nRegs);
    iVar5 = Aig_ManCheck(p_00);
    if (iVar5 == 0) {
      puts("Aig_ManDupTrim(): The check has failed.");
    }
    return p_00;
  }
  __assert_fail("Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                ,0x1b9,"Aig_Man_t *Aig_ManDupTrim(Aig_Man_t *)");
}

Assistant:

Aig_Man_t * Aig_ManDupTrim( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i, nNodes;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    // create the PIs
    Aig_ManCleanData( p );
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
            pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
        else if ( Aig_ObjIsCi(pObj) )
            pObjNew = (Aig_ObjRefs(pObj) > 0 || Saig_ObjIsLo(p, pObj)) ? Aig_ObjCreateCi(pNew) : NULL;
        else if ( Aig_ObjIsCo(pObj) )
            pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        else if ( Aig_ObjIsConst1(pObj) )
            pObjNew = Aig_ManConst1(pNew);
        else
            assert( 0 );
        pObj->pData = pObjNew;
    }
    assert( Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    if ( (nNodes = Aig_ManCleanup( pNew )) )
        printf( "Aig_ManDupTrim(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupTrim(): The check has failed.\n" );
    return pNew;
}